

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_st_xdr.c
# Opt level: O1

_Bool xdr_rpcbs_rmtcalllist(XDR *xdrs,rpcbs_rmtcalllist *objp)

{
  rpcvers_t *prVar1;
  rpcproc_t *prVar2;
  int32_t *piVar3;
  xdr_op xVar4;
  uint uVar5;
  uint *puVar6;
  char cVar7;
  _Bool _Var8;
  bool_t bVar9;
  uint *puVar10;
  ulong uVar11;
  u_int __maxsize;
  uint *puVar12;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  undefined8 uVar13;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *extraout_RDX_03;
  uint *extraout_RDX_04;
  uint *extraout_RDX_05;
  uint *extraout_RDX_06;
  uint *extraout_RDX_07;
  uint *extraout_RDX_08;
  uint *extraout_RDX_09;
  uint *extraout_RDX_10;
  char *pcVar14;
  
  xVar4 = xdrs->x_op;
  if (xVar4 != XDR_FREE) {
    if (xVar4 == XDR_DECODE) {
      puVar10 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_tail;
      puVar12 = puVar10 + 6;
      if (puVar6 < puVar12) {
        puVar10 = (uint *)0x0;
      }
      else {
        xdrs->x_data = (uint8_t *)puVar12;
      }
      if (puVar10 == (uint *)0x0) {
        puVar12 = (uint *)xdrs->x_data;
        if (puVar6 < puVar12 + 1) {
          _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,&objp->prog);
          puVar12 = extraout_RDX;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar14 = "%s:%u ERROR prog";
            uVar13 = 0x91;
            goto LAB_00119539;
          }
        }
        else {
          uVar5 = *puVar12;
          objp->prog = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                       uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)(puVar12 + 1);
        }
        puVar10 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_tail < puVar10) {
          _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,&objp->vers);
          puVar12 = extraout_RDX_01;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar14 = "%s:%u ERROR vers";
            uVar13 = 0x96;
            goto LAB_00119539;
          }
        }
        else {
          uVar5 = *(uint *)xdrs->x_data;
          objp->vers = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                       uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar10;
        }
        puVar10 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_tail < puVar10) {
          _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,&objp->proc);
          puVar12 = extraout_RDX_03;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar14 = "%s:%u ERROR proc";
            uVar13 = 0x9b;
            goto LAB_00119539;
          }
        }
        else {
          uVar5 = *(uint *)xdrs->x_data;
          objp->proc = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                       uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar10;
        }
        puVar10 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_tail < puVar10) {
          _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)&objp->success);
          puVar12 = extraout_RDX_05;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar14 = "%s:%u ERROR success";
            uVar13 = 0xa0;
            goto LAB_00119539;
          }
        }
        else {
          uVar5 = *(uint *)xdrs->x_data;
          objp->success =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar10;
        }
        puVar10 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_tail < puVar10) {
          _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)&objp->failure);
          puVar12 = extraout_RDX_07;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar14 = "%s:%u ERROR failure";
            uVar13 = 0xa5;
            goto LAB_00119539;
          }
        }
        else {
          uVar5 = *(uint *)xdrs->x_data;
          objp->failure =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar10;
        }
        puVar10 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_tail < puVar10) {
          _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)&objp->indirect);
          puVar12 = extraout_RDX_09;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            pcVar14 = "%s:%u ERROR indirect";
            uVar13 = 0xaa;
LAB_00119539:
            (*__ntirpc_pkg_params.warnx_)(pcVar14,"xdr_rpcbs_rmtcalllist",uVar13);
            return false;
          }
        }
        else {
          uVar5 = *(uint *)xdrs->x_data;
          objp->indirect =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar10;
        }
      }
      else {
        uVar5 = *puVar10;
        objp->prog = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
        ;
        uVar5 = puVar10[1];
        objp->vers = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
        ;
        uVar5 = puVar10[2];
        objp->proc = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
        ;
        uVar5 = puVar10[3];
        objp->success =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        uVar5 = puVar10[4];
        objp->failure =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        uVar5 = puVar10[5];
        objp->indirect =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      }
      cVar7 = xdr_string_decode(xdrs,&objp->netid,(u_int)puVar12);
    }
    else {
      if (xVar4 != XDR_ENCODE) {
        return false;
      }
      puVar10 = (uint *)xdrs->x_data;
      puVar6 = (uint *)(xdrs->x_v).vio_wrap;
      puVar12 = puVar10 + 6;
      if (puVar6 < puVar12) {
        puVar10 = (uint *)0x0;
      }
      else {
        xdrs->x_data = (uint8_t *)puVar12;
        if ((xdrs->x_v).vio_tail < puVar12) {
          (xdrs->x_v).vio_tail = (uint8_t *)puVar12;
          *(uint **)((long)xdrs->x_base + 0x10) = puVar12;
        }
      }
      uVar5 = objp->prog;
      if (puVar10 == (uint *)0x0) {
        puVar12 = (uint *)((long)xdrs->x_data + 4);
        if (puVar6 < puVar12) {
          _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
          puVar12 = extraout_RDX_00;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            uVar11 = (ulong)objp->prog;
            pcVar14 = "%s:%u ERROR prog %u";
            uVar13 = 0x59;
            goto LAB_00119598;
          }
        }
        else {
          *(uint *)xdrs->x_data =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar12;
        }
        uVar5 = objp->vers;
        puVar10 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_wrap < puVar10) {
          _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
          puVar12 = extraout_RDX_02;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            uVar11 = (ulong)objp->vers;
            pcVar14 = "%s:%u ERROR vers %u";
            uVar13 = 0x5f;
            goto LAB_00119598;
          }
        }
        else {
          *(uint *)xdrs->x_data =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar10;
        }
        uVar5 = objp->proc;
        puVar10 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_wrap < puVar10) {
          _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
          puVar12 = extraout_RDX_04;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            uVar11 = (ulong)objp->proc;
            pcVar14 = "%s:%u ERROR proc %u";
            uVar13 = 0x65;
            goto LAB_00119598;
          }
        }
        else {
          *(uint *)xdrs->x_data =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar10;
        }
        uVar5 = objp->success;
        puVar10 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_wrap < puVar10) {
          _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
          puVar12 = extraout_RDX_06;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            uVar11 = (ulong)(uint)objp->success;
            pcVar14 = "%s:%u ERROR success %u";
            uVar13 = 0x6b;
            goto LAB_00119598;
          }
        }
        else {
          *(uint *)xdrs->x_data =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar10;
        }
        uVar5 = objp->failure;
        puVar10 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_wrap < puVar10) {
          _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
          puVar12 = extraout_RDX_08;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            uVar11 = (ulong)(uint)objp->failure;
            pcVar14 = "%s:%u ERROR failure %u";
            uVar13 = 0x71;
            goto LAB_00119598;
          }
        }
        else {
          *(uint *)xdrs->x_data =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar10;
        }
        uVar5 = objp->indirect;
        puVar10 = (uint *)((long)xdrs->x_data + 4);
        if ((xdrs->x_v).vio_wrap < puVar10) {
          _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
          puVar12 = extraout_RDX_10;
          if (!_Var8) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
              return false;
            }
            uVar11 = (ulong)(uint)objp->indirect;
            pcVar14 = "%s:%u ERROR indirect %u";
            uVar13 = 0x77;
LAB_00119598:
            (*__ntirpc_pkg_params.warnx_)(pcVar14,"xdr_rpcbs_rmtcalllist",uVar13,uVar11);
            return false;
          }
        }
        else {
          *(uint *)xdrs->x_data =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          xdrs->x_data = (uint8_t *)puVar10;
        }
      }
      else {
        *puVar10 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        uVar5 = objp->vers;
        puVar10[1] = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
        ;
        uVar5 = objp->proc;
        puVar10[2] = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
        ;
        uVar5 = objp->success;
        puVar10[3] = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
        ;
        uVar5 = objp->failure;
        puVar10[4] = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
        ;
        uVar5 = objp->indirect;
        puVar10[5] = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
        ;
      }
      cVar7 = xdr_string_encode(xdrs,&objp->netid,(u_int)puVar12);
    }
    goto LAB_00119044;
  }
  xVar4 = xdrs->x_op;
  if (xVar4 != XDR_FREE) {
    prVar1 = &objp->vers;
    if (xVar4 == XDR_DECODE) {
      puVar12 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar12) {
        _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,prVar1);
        goto LAB_00119121;
      }
      uVar5 = *(uint *)xdrs->x_data;
      *prVar1 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      xdrs->x_data = (uint8_t *)puVar12;
    }
    else {
      if (xVar4 != XDR_ENCODE) {
        return false;
      }
      uVar5 = *prVar1;
      puVar12 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar12) {
        _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
LAB_00119121:
        if (_Var8 == false) {
          return false;
        }
      }
      else {
        *(uint *)xdrs->x_data =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        xdrs->x_data = (uint8_t *)puVar12;
      }
    }
  }
  xVar4 = xdrs->x_op;
  if (xVar4 != XDR_FREE) {
    prVar2 = &objp->proc;
    if (xVar4 == XDR_DECODE) {
      puVar12 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar12) {
        _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,prVar2);
        goto LAB_001192fd;
      }
      uVar5 = *(uint *)xdrs->x_data;
      *prVar2 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      xdrs->x_data = (uint8_t *)puVar12;
    }
    else {
      if (xVar4 != XDR_ENCODE) {
        return false;
      }
      uVar5 = *prVar2;
      puVar12 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar12) {
        _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
LAB_001192fd:
        if (_Var8 == false) {
          return false;
        }
      }
      else {
        *(uint *)xdrs->x_data =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        xdrs->x_data = (uint8_t *)puVar12;
      }
    }
  }
  xVar4 = xdrs->x_op;
  if (xVar4 != XDR_FREE) {
    piVar3 = &objp->success;
    if (xVar4 == XDR_DECODE) {
      puVar12 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar12) {
        _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)piVar3);
        goto LAB_001194d9;
      }
      uVar5 = *(uint *)xdrs->x_data;
      *piVar3 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      xdrs->x_data = (uint8_t *)puVar12;
    }
    else {
      if (xVar4 != XDR_ENCODE) {
        return false;
      }
      uVar5 = *piVar3;
      puVar12 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar12) {
        _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
LAB_001194d9:
        if (_Var8 == false) {
          return false;
        }
      }
      else {
        *(uint *)xdrs->x_data =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        xdrs->x_data = (uint8_t *)puVar12;
      }
    }
  }
  xVar4 = xdrs->x_op;
  if (xVar4 != XDR_FREE) {
    piVar3 = &objp->failure;
    if (xVar4 == XDR_DECODE) {
      puVar12 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar12) {
        _Var8 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)piVar3);
        goto LAB_00119602;
      }
      uVar5 = *(uint *)xdrs->x_data;
      *piVar3 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      xdrs->x_data = (uint8_t *)puVar12;
    }
    else {
      if (xVar4 != XDR_ENCODE) {
        return false;
      }
      uVar5 = *piVar3;
      puVar12 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar12) {
        _Var8 = (*xdrs->x_ops->x_putunit)(xdrs,uVar5);
LAB_00119602:
        if (_Var8 == false) {
          return false;
        }
      }
      else {
        *(uint *)xdrs->x_data =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        xdrs->x_data = (uint8_t *)puVar12;
      }
    }
  }
  bVar9 = xdr_int32_t((XDR *)xdrs,&objp->indirect);
  if ((char)bVar9 == '\0') {
    return false;
  }
  bVar9 = xdr_string((XDR *)xdrs,&objp->netid,__maxsize);
  cVar7 = (char)bVar9;
LAB_00119044:
  if (cVar7 == '\0') {
    return false;
  }
  bVar9 = xdr_pointer((XDR *)xdrs,(char **)&objp->next,0x28,xdr_rpcbs_rmtcalllist);
  return SUB41(bVar9,0);
}

Assistant:

bool
xdr_rpcbs_rmtcalllist(XDR *xdrs, rpcbs_rmtcalllist *objp)
{
	int32_t *buf;

	if (xdrs->x_op == XDR_ENCODE) {
		buf = xdr_inline_encode(xdrs, 6 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			/* most likely */
			IXDR_PUT_U_INT32(buf, objp->prog);
			IXDR_PUT_U_INT32(buf, objp->vers);
			IXDR_PUT_U_INT32(buf, objp->proc);
			IXDR_PUT_INT32(buf, objp->success);
			IXDR_PUT_INT32(buf, objp->failure);
			IXDR_PUT_INT32(buf, objp->indirect);
		} else if (!XDR_PUTUINT32(xdrs, objp->prog)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR prog %u",
				__func__, __LINE__,
				objp->prog);
			return (false);
		} else if (!XDR_PUTUINT32(xdrs, objp->vers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR vers %u",
				__func__, __LINE__,
				objp->vers);
			return (false);
		} else if (!XDR_PUTUINT32(xdrs, objp->proc)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR proc %u",
				__func__, __LINE__,
				objp->proc);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->success)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR success %u",
				__func__, __LINE__,
				objp->success);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->failure)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR failure %u",
				__func__, __LINE__,
				objp->failure);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->indirect)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR indirect %u",
				__func__, __LINE__,
				objp->indirect);
			return (false);
		}
		if (!xdr_string_encode(xdrs, &objp->netid, RPC_MAXDATASIZE))
			return (false);
		if (!xdr_pointer(xdrs, (void **)&objp->next,
				 sizeof(rpcbs_rmtcalllist),
				 (xdrproc_t) xdr_rpcbs_rmtcalllist))
			return (false);
		return (true);
	}

	if (xdrs->x_op == XDR_DECODE) {
		buf = xdr_inline_decode(xdrs, 6 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			/* most likely */
			objp->prog = (rpcprog_t) IXDR_GET_U_INT32(buf);
			objp->vers = (rpcvers_t) IXDR_GET_U_INT32(buf);
			objp->proc = (rpcproc_t) IXDR_GET_U_INT32(buf);
			objp->success = (int)IXDR_GET_INT32(buf);
			objp->failure = (int)IXDR_GET_INT32(buf);
			objp->indirect = (int)IXDR_GET_INT32(buf);
		} else if (!XDR_GETUINT32(xdrs, &(objp->prog))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR prog",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETUINT32(xdrs, &(objp->vers))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR vers",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETUINT32(xdrs, &(objp->proc))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR proc",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->success))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR success",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->failure))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR failure",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->indirect))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR indirect",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_string_decode(xdrs, &objp->netid, RPC_MAXDATASIZE))
			return (false);
		if (!xdr_pointer(xdrs, (void **)&objp->next,
				 sizeof(rpcbs_rmtcalllist),
				 (xdrproc_t) xdr_rpcbs_rmtcalllist))
			return (false);
		return (true);
	}

	if (!xdr_u_int32_t(xdrs, &objp->prog))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->vers))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->proc))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->success))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->failure))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->indirect))
		return (false);
	if (!xdr_string(xdrs, &objp->netid, RPC_MAXDATASIZE))
		return (false);
	if (!xdr_pointer(xdrs, (void **)&objp->next,
			 sizeof(rpcbs_rmtcalllist),
			 (xdrproc_t) xdr_rpcbs_rmtcalllist))
		return (false);

	return (true);
}